

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clickrem.c
# Opt level: O3

DUMB_CLICK * dumb_click_mergesort(DUMB_CLICK *click,int n_clicks)

{
  undefined8 *puVar1;
  DUMB_CLICK *pDVar2;
  DUMB_CLICK *pDVar3;
  DUMB_CLICK *pDVar4;
  int iVar5;
  DUMB_CLICK *pDVar6;
  DUMB_CLICK *c1;
  undefined1 local_28 [8];
  DUMB_CLICK *local_20;
  
  if (1 < n_clicks) {
    puVar1 = (undefined8 *)(local_28 + 8);
    local_20 = click;
    iVar5 = 0;
    do {
      puVar1 = (undefined8 *)*puVar1;
      iVar5 = iVar5 + 2;
    } while (iVar5 < n_clicks);
    pDVar3 = (DUMB_CLICK *)*puVar1;
    *puVar1 = 0;
    local_28 = (undefined1  [8])click;
    pDVar2 = dumb_click_mergesort(click,n_clicks + 1U >> 1);
    local_20 = pDVar2;
    pDVar3 = dumb_click_mergesort(pDVar3,(uint)n_clicks >> 1);
    pDVar6 = (DUMB_CLICK *)local_28;
    while ((pDVar4 = pDVar3, pDVar2 != (DUMB_CLICK *)0x0 && (pDVar4 != (DUMB_CLICK *)0x0))) {
      if (pDVar4->pos < pDVar2->pos) {
        pDVar6->next = pDVar4;
        pDVar3 = pDVar4->next;
        pDVar6 = pDVar4;
      }
      else {
        pDVar6->next = pDVar2;
        pDVar3 = pDVar4;
        pDVar6 = pDVar2;
        pDVar2 = pDVar2->next;
      }
    }
    if (pDVar4 == (DUMB_CLICK *)0x0) {
      pDVar4 = pDVar2;
    }
    pDVar6->next = pDVar4;
    click = (DUMB_CLICK *)local_28;
  }
  return click;
}

Assistant:

static DUMB_CLICK *dumb_click_mergesort(DUMB_CLICK *click, int n_clicks)
{
	int i;
	DUMB_CLICK *c1, *c2, **cp;

	if (n_clicks <= 1) return click;

	/* Split the list into two */
	c1 = click;
	cp = &c1;
	for (i = 0; i < n_clicks; i += 2) cp = &(*cp)->next;
	c2 = *cp;
	*cp = NULL;

	/* Sort the sublists */
	c1 = dumb_click_mergesort(c1, (n_clicks + 1) >> 1);
	c2 = dumb_click_mergesort(c2, n_clicks >> 1);

	/* Merge them */
	cp = &click;
	while (c1 && c2) {
		if (c1->pos > c2->pos) {
			*cp = c2;
			c2 = c2->next;
		} else {
			*cp = c1;
			c1 = c1->next;
		}
		cp = &(*cp)->next;
	}
	if (c2)
		*cp = c2;
	else
		*cp = c1;

	return click;
}